

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_read_buf_callback
                  (mz_zip_archive *pZip,char *pArchive_name,mz_file_read_func read_callback,
                  void *callback_opaque,mz_uint64 max_size,time_t *pFile_time,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  mz_uint16 filename_size;
  mz_uint16 extra_size_00;
  mz_uint64 mVar2;
  mz_uint8 mVar3;
  mz_bool mVar6;
  mz_uint flags;
  tdefl_status tVar7;
  int iVar8;
  mz_uint32 mVar9;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  mz_uint8 *ptr;
  ulong uVar14;
  mz_ulong mVar15;
  tdefl_compressor *d;
  mz_uint64 *local_4b8;
  mz_uint64 *local_4a8;
  mz_uint64 *local_498;
  mz_uint64 local_488;
  mz_uint64 local_478;
  mz_uint64 *local_458;
  mz_uint64 *local_448;
  mz_uint64 *local_438;
  mz_uint64 *local_420;
  mz_uint64 *local_410;
  mz_uint64 *local_400;
  mz_uint64 *local_3f0;
  uint local_3dc;
  undefined1 local_3d8;
  undefined1 local_3d7;
  undefined1 local_3d6;
  undefined1 local_3d5;
  mz_uint32 local_dir_footer_size;
  mz_uint8 local_dir_footer [24];
  size_t n_1;
  tdefl_flush flush;
  tdefl_status status;
  tdefl_compressor *pComp;
  mz_zip_writer_add_state state;
  mz_bool result;
  size_t n;
  void *pRead_buf;
  mz_uint64 cur_archive_header_file_ofs;
  mz_uint64 file_ofs;
  mz_zip_internal_state *pState;
  mz_uint8 extra_data [28];
  uint local_334;
  mz_zip_internal_state **ppmStack_330;
  mz_uint32 extra_size;
  mz_uint8 *pExtra_data;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint mStack_2d0;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint num_alignment_padding_bytes;
  mz_uint level;
  mz_uint uncomp_crc32;
  mz_uint16 gen_flags;
  time_t *pFile_time_local;
  mz_uint64 max_size_local;
  void *callback_opaque_local;
  mz_file_read_func read_callback_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  undefined4 local_23c;
  char *local_238;
  undefined4 local_22c;
  char *local_228;
  undefined4 local_cc;
  mz_uint8 *local_c8;
  undefined4 local_bc;
  mz_uint8 *local_b8;
  mz_uint local_ac;
  mz_uint32 *local_a8;
  undefined4 local_9c;
  undefined1 *local_98;
  mz_uint64 local_90;
  mz_uint8 *local_88;
  undefined4 local_7c;
  mz_uint8 *local_78;
  undefined4 local_6c;
  mz_uint8 *local_68;
  size_t local_60;
  mz_uint8 *local_58;
  undefined4 local_4c;
  mz_uint8 *local_48;
  undefined4 local_3c;
  mz_uint8 *local_38;
  mz_uint8 mVar4;
  mz_uint8 mVar5;
  
  num_alignment_padding_bytes = 0;
  local_dir_header_ofs._6_2_ = 0;
  local_dir_header_ofs._4_2_ = 0;
  local_dir_header_ofs._2_2_ = 0;
  uncomp_size = pZip->m_archive_size;
  comp_size = 0;
  archive_name_size = 0;
  ppmStack_330 = (mz_zip_internal_state **)0x0;
  local_334 = 0;
  cur_archive_header_file_ofs = 0;
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  _dos_time = level_and_flags & 0xf;
  level._2_2_ = 8;
  if ((level_and_flags & 0x20000) != 0) {
    level._2_2_ = 0;
  }
  if ((level_and_flags & 0x10000) == 0) {
    level._2_2_ = level._2_2_ | 0x800;
  }
  if (((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
       (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (pArchive_name == (char *)0x0)) ||
     (((comment_size != 0 && (pComment == (void *)0x0)) || (10 < _dos_time)))) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    pmVar1 = pZip->m_pState;
    if ((pmVar1->m_zip64 == 0) && (0xffffffff < max_size)) {
      pmVar1->m_zip64 = 1;
    }
    if ((level_and_flags & 0x400) == 0) {
      _uncomp_crc32 = pFile_time;
      pFile_time_local = (time_t *)max_size;
      max_size_local = (mz_uint64)callback_opaque;
      callback_opaque_local = read_callback;
      read_callback_local = (mz_file_read_func)pArchive_name;
      pArchive_name_local = (char *)pZip;
      mVar6 = mz_zip_writer_validate_archive_name(pArchive_name);
      if (mVar6 == 0) {
        if (pArchive_name_local != (char *)0x0) {
          pArchive_name_local[0x1c] = '\x19';
          pArchive_name_local[0x1d] = '\0';
          pArchive_name_local[0x1e] = '\0';
          pArchive_name_local[0x1f] = '\0';
        }
        pZip_local._0_4_ = 0;
      }
      else {
        if (pmVar1->m_zip64 == 0) {
          if (*(int *)(pArchive_name_local + 0x10) == 0xffff) {
            pmVar1->m_zip64 = 1;
          }
        }
        else if (*(int *)(pArchive_name_local + 0x10) == -1) {
          if (pArchive_name_local != (char *)0x0) {
            pArchive_name_local[0x1c] = '\x02';
            pArchive_name_local[0x1d] = '\0';
            pArchive_name_local[0x1e] = '\0';
            pArchive_name_local[0x1f] = '\0';
          }
          return 0;
        }
        sVar10 = strlen((char *)read_callback_local);
        if (sVar10 < 0x10000) {
          mStack_2d0 = mz_zip_writer_compute_padding_needed_for_file_alignment
                                 ((mz_zip_archive *)pArchive_name_local);
          if ((pmVar1->m_central_dir).m_size + sVar10 + 0x4a + (ulong)comment_size < 0xffffffff) {
            if ((pmVar1->m_zip64 == 0) &&
               (0xffffffff <
                *(long *)pArchive_name_local + (ulong)mStack_2d0 + sVar10 * 2 + (ulong)comment_size
                + (ulong)user_extra_data_len + (pmVar1->m_central_dir).m_size + 0x472 +
                (ulong)user_extra_data_central_len)) {
              pmVar1->m_zip64 = 1;
            }
            if (_uncomp_crc32 != (time_t *)0x0) {
              mz_zip_time_t_to_dos_time
                        (*_uncomp_crc32,(mz_uint16 *)((long)&local_dir_header_ofs + 4),
                         (mz_uint16 *)((long)&local_dir_header_ofs + 2));
            }
            if (pFile_time_local < (time_t *)0x4) {
              _dos_time = 0;
            }
            mVar6 = mz_zip_writer_write_zeros
                              ((mz_zip_archive *)pArchive_name_local,uncomp_size,mStack_2d0);
            if (mVar6 == 0) {
              if (pArchive_name_local != (char *)0x0) {
                pArchive_name_local[0x1c] = '\x13';
                pArchive_name_local[0x1d] = '\0';
                pArchive_name_local[0x1e] = '\0';
                pArchive_name_local[0x1f] = '\0';
              }
              pZip_local._0_4_ = 0;
            }
            else {
              uncomp_size = mStack_2d0 + uncomp_size;
              cur_archive_file_ofs = uncomp_size;
              if ((*(long *)(pArchive_name_local + 0x20) != 0) &&
                 ((uncomp_size & *(long *)(pArchive_name_local + 0x20) - 1U) != 0)) {
                __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h"
                              ,0x2290,
                              "mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *, const char *, mz_file_read_func, void *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, mz_uint32, const char *, mz_uint, const char *, mz_uint)"
                             );
              }
              if ((pFile_time_local != (time_t *)0x0) && (_dos_time != 0)) {
                local_dir_header_ofs._6_2_ = 8;
              }
              memset(&pExtra_data,0,0x1e);
              extra_size_00 = (mz_uint16)user_extra_data_len;
              filename_size = (mz_uint16)sVar10;
              if (pmVar1->m_zip64 == 0) {
                if ((0xffffffff < archive_name_size) || (0xffffffff < uncomp_size)) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1d';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                mVar6 = mz_zip_writer_create_local_dir_header
                                  ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pExtra_data,
                                   filename_size,extra_size_00,0,0,0,local_dir_header_ofs._6_2_,
                                   level._2_2_,local_dir_header_ofs._4_2_,local_dir_header_ofs._2_2_
                                  );
                if (mVar6 == 0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1b';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                lVar11 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    &pExtra_data,0x1e);
                if (lVar11 != 0x1e) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = uncomp_size + 0x1e;
                sVar12 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    read_callback_local,sVar10);
                if (sVar12 != sVar10) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = sVar10 + uncomp_size;
              }
              else {
                if (((time_t *)0xfffffffe < pFile_time_local) || (0xfffffffe < cur_archive_file_ofs)
                   ) {
                  ppmStack_330 = &pState;
                  if ((level_and_flags & 0x20000) == 0) {
                    if (cur_archive_file_ofs < 0xffffffff) {
                      local_420 = (mz_uint64 *)0x0;
                    }
                    else {
                      local_420 = &cur_archive_file_ofs;
                    }
                    local_334 = mz_zip_writer_create_zip64_extra_data
                                          ((mz_uint8 *)&pState,(mz_uint64 *)0x0,(mz_uint64 *)0x0,
                                           local_420);
                  }
                  else {
                    if (pFile_time_local < (time_t *)0xffffffff) {
                      local_3f0 = (mz_uint64 *)0x0;
                      local_400 = (mz_uint64 *)0x0;
                    }
                    else {
                      local_3f0 = &comp_size;
                      local_400 = &archive_name_size;
                    }
                    if (cur_archive_file_ofs < 0xffffffff) {
                      local_410 = (mz_uint64 *)0x0;
                    }
                    else {
                      local_410 = &cur_archive_file_ofs;
                    }
                    local_334 = mz_zip_writer_create_zip64_extra_data
                                          ((mz_uint8 *)&pState,local_3f0,local_400,local_410);
                  }
                }
                mVar6 = mz_zip_writer_create_local_dir_header
                                  ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pExtra_data,
                                   filename_size,(short)local_334 + extra_size_00,0,0,0,
                                   local_dir_header_ofs._6_2_,level._2_2_,local_dir_header_ofs._4_2_
                                   ,local_dir_header_ofs._2_2_);
                if (mVar6 == 0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1b';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                lVar11 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    &pExtra_data,0x1e);
                if (lVar11 != 0x1e) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = uncomp_size + 0x1e;
                sVar12 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    read_callback_local,sVar10);
                if (sVar12 != sVar10) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = sVar10 + uncomp_size;
                uVar13 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,&pState,
                                    local_334);
                if (uVar13 != local_334) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = local_334 + uncomp_size;
              }
              if (user_extra_data_len != 0) {
                uVar13 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    user_extra_data,user_extra_data_len);
                if (uVar13 != user_extra_data_len) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                uncomp_size = user_extra_data_len + uncomp_size;
              }
              if (pFile_time_local != (time_t *)0x0) {
                ptr = (mz_uint8 *)
                      (**(code **)(pArchive_name_local + 0x28))
                                (*(undefined8 *)(pArchive_name_local + 0x40),1,0x10000);
                if (ptr == (mz_uint8 *)0x0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x10';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                if (_dos_time == 0) {
                  while (uVar13 = (*(code *)callback_opaque_local)
                                            (max_size_local,cur_archive_header_file_ofs,ptr,0x10000)
                        , uVar13 != 0) {
                    if ((0x10000 < uVar13) ||
                       (pFile_time_local < (time_t *)(cur_archive_header_file_ofs + uVar13))) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x14';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    uVar14 = (**(code **)(pArchive_name_local + 0x50))
                                       (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,ptr,
                                        uVar13);
                    if (uVar14 != uVar13) {
                      (**(code **)(pArchive_name_local + 0x30))
                                (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x13';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      return 0;
                    }
                    cur_archive_header_file_ofs = uVar13 + cur_archive_header_file_ofs;
                    mVar15 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,uVar13);
                    num_alignment_padding_bytes = (mz_uint)mVar15;
                    uncomp_size = uVar13 + uncomp_size;
                  }
                  archive_name_size = cur_archive_header_file_ofs;
                }
                else {
                  state.m_comp_size._4_4_ = 0;
                  d = (tdefl_compressor *)
                      (**(code **)(pArchive_name_local + 0x28))
                                (*(undefined8 *)(pArchive_name_local + 0x40),1,0x4df78);
                  if (d == (tdefl_compressor *)0x0) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x10';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  pComp = (tdefl_compressor *)pArchive_name_local;
                  state.m_pZip = (mz_zip_archive *)uncomp_size;
                  state.m_cur_archive_file_ofs = 0;
                  flags = tdefl_create_comp_flags_from_zip_params(_dos_time,-0xf,0);
                  tVar7 = tdefl_init(d,mz_zip_writer_add_put_buf_callback,&pComp,flags);
                  if (tVar7 != TDEFL_STATUS_OKAY) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),d);
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x1b';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  do {
                    n_1._0_4_ = TDEFL_NO_FLUSH;
                    uVar13 = (*(code *)callback_opaque_local)
                                       (max_size_local,cur_archive_header_file_ofs,ptr,0x10000);
                    if ((0x10000 < uVar13) ||
                       (pFile_time_local < (time_t *)(cur_archive_header_file_ofs + uVar13))) {
                      local_228 = pArchive_name_local;
                      local_22c = 0x14;
                      if (pArchive_name_local != (char *)0x0) {
                        pArchive_name_local[0x1c] = '\x14';
                        pArchive_name_local[0x1d] = '\0';
                        pArchive_name_local[0x1e] = '\0';
                        pArchive_name_local[0x1f] = '\0';
                      }
                      goto LAB_0011804a;
                    }
                    cur_archive_header_file_ofs = uVar13 + cur_archive_header_file_ofs;
                    mVar15 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,uVar13);
                    num_alignment_padding_bytes = (mz_uint)mVar15;
                    if ((*(long *)(pArchive_name_local + 0x58) != 0) &&
                       (iVar8 = (**(code **)(pArchive_name_local + 0x58))
                                          (*(undefined8 *)(pArchive_name_local + 0x60)), iVar8 != 0)
                       ) {
                      n_1._0_4_ = TDEFL_FULL_FLUSH;
                    }
                    if (uVar13 == 0) {
                      n_1._0_4_ = TDEFL_FINISH;
                    }
                    tVar7 = tdefl_compress_buffer(d,ptr,uVar13,(tdefl_flush)n_1);
                    if (tVar7 == TDEFL_STATUS_DONE) {
                      state.m_comp_size._4_4_ = 1;
                      goto LAB_0011804a;
                    }
                  } while (tVar7 == TDEFL_STATUS_OKAY);
                  local_238 = pArchive_name_local;
                  local_23c = 0xc;
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\f';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
LAB_0011804a:
                  (**(code **)(pArchive_name_local + 0x30))
                            (*(undefined8 *)(pArchive_name_local + 0x40),d);
                  if (state.m_comp_size._4_4_ == 0) {
                    (**(code **)(pArchive_name_local + 0x30))
                              (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
                    return 0;
                  }
                  archive_name_size = state.m_cur_archive_file_ofs;
                  uncomp_size = (mz_uint64)state.m_pZip;
                }
                comp_size = cur_archive_header_file_ofs;
                (**(code **)(pArchive_name_local + 0x30))
                          (*(undefined8 *)(pArchive_name_local + 0x40),ptr);
              }
              if ((level_and_flags & 0x20000) == 0) {
                local_3dc = 0x10;
                local_98 = &local_3d8;
                local_9c = 0x8074b50;
                local_3d8 = 0x50;
                local_3d7 = 0x4b;
                local_3d6 = 7;
                local_3d5 = 8;
                local_a8 = &local_dir_footer_size;
                local_ac = num_alignment_padding_bytes;
                local_dir_footer_size._0_1_ = (undefined1)num_alignment_padding_bytes;
                local_dir_footer_size._1_1_ = (undefined1)(num_alignment_padding_bytes >> 8);
                local_dir_footer_size._2_1_ = (undefined1)(num_alignment_padding_bytes >> 0x10);
                local_dir_footer_size._3_1_ = (undefined1)(num_alignment_padding_bytes >> 0x18);
                local_dir_footer[0] = (mz_uint8)archive_name_size;
                local_dir_footer[1] = (mz_uint8)(archive_name_size >> 8);
                local_dir_footer[2] = (mz_uint8)(archive_name_size >> 0x10);
                local_dir_footer[3] = (mz_uint8)(archive_name_size >> 0x18);
                mVar3 = (mz_uint8)(comp_size >> 8);
                mVar4 = (mz_uint8)(comp_size >> 0x10);
                mVar5 = (mz_uint8)(comp_size >> 0x18);
                if (ppmStack_330 == (mz_zip_internal_state **)0x0) {
                  if (0xffffffff < archive_name_size) {
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x1d';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  local_b8 = local_dir_footer;
                  local_c8 = local_dir_footer + 4;
                  local_cc = (int)comp_size;
                  local_bc = (int)archive_name_size;
                  local_dir_footer[4] = (mz_uint8)comp_size;
                  local_dir_footer[5] = mVar3;
                  local_dir_footer[6] = mVar4;
                  local_dir_footer[7] = mVar5;
                }
                else {
                  local_58 = local_dir_footer;
                  local_60 = archive_name_size;
                  local_48 = local_dir_footer + 4;
                  local_4c = (undefined4)(archive_name_size >> 0x20);
                  local_dir_footer[4] = (mz_uint8)(archive_name_size >> 0x20);
                  local_dir_footer[5] = (mz_uint8)(archive_name_size >> 0x28);
                  local_dir_footer[6] = (mz_uint8)(archive_name_size >> 0x30);
                  local_dir_footer[7] = (mz_uint8)(archive_name_size >> 0x38);
                  local_88 = local_dir_footer + 8;
                  local_90 = comp_size;
                  local_78 = local_dir_footer + 0xc;
                  local_7c = (undefined4)(comp_size >> 0x20);
                  local_dir_footer[0xc] = (mz_uint8)(comp_size >> 0x20);
                  local_dir_footer[0xd] = (mz_uint8)(comp_size >> 0x28);
                  local_dir_footer[0xe] = (mz_uint8)(comp_size >> 0x30);
                  local_dir_footer[0xf] = (mz_uint8)(comp_size >> 0x38);
                  local_3dc = 0x18;
                  local_6c = (int)comp_size;
                  local_68 = local_88;
                  local_3c = (int)archive_name_size;
                  local_38 = local_58;
                  local_dir_footer[8] = (mz_uint8)comp_size;
                  local_dir_footer[9] = mVar3;
                  local_dir_footer[10] = mVar4;
                  local_dir_footer[0xb] = mVar5;
                }
                uVar13 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),uncomp_size,
                                    &local_3d8,local_3dc);
                if (uVar13 != local_3dc) {
                  return 0;
                }
                uncomp_size = local_3dc + uncomp_size;
              }
              if ((level_and_flags & 0x20000) != 0) {
                if (ppmStack_330 != (mz_zip_internal_state **)0x0) {
                  if (pFile_time_local < (time_t *)0xffffffff) {
                    local_438 = (mz_uint64 *)0x0;
                    local_448 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_438 = &comp_size;
                    local_448 = &archive_name_size;
                  }
                  if (cur_archive_file_ofs < 0xffffffff) {
                    local_458 = (mz_uint64 *)0x0;
                  }
                  else {
                    local_458 = &cur_archive_file_ofs;
                  }
                  local_334 = mz_zip_writer_create_zip64_extra_data
                                        ((mz_uint8 *)&pState,local_438,local_448,local_458);
                }
                if (pFile_time_local < (time_t *)0xffffffff) {
                  local_488 = archive_name_size;
                  local_478 = comp_size;
                }
                else {
                  local_478 = 0xffffffff;
                  local_488 = 0xffffffff;
                }
                mVar6 = mz_zip_writer_create_local_dir_header
                                  ((mz_zip_archive *)pArchive_name_local,(mz_uint8 *)&pExtra_data,
                                   filename_size,(short)local_334 + extra_size_00,local_478,
                                   local_488,num_alignment_padding_bytes,local_dir_header_ofs._6_2_,
                                   level._2_2_,local_dir_header_ofs._4_2_,local_dir_header_ofs._2_2_
                                  );
                mVar2 = cur_archive_file_ofs;
                if (mVar6 == 0) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x1b';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                lVar11 = (**(code **)(pArchive_name_local + 0x50))
                                   (*(undefined8 *)(pArchive_name_local + 0x60),cur_archive_file_ofs
                                    ,&pExtra_data,0x1e);
                if (lVar11 != 0x1e) {
                  if (pArchive_name_local != (char *)0x0) {
                    pArchive_name_local[0x1c] = '\x13';
                    pArchive_name_local[0x1d] = '\0';
                    pArchive_name_local[0x1e] = '\0';
                    pArchive_name_local[0x1f] = '\0';
                  }
                  return 0;
                }
                if (ppmStack_330 != (mz_zip_internal_state **)0x0) {
                  sVar12 = (**(code **)(pArchive_name_local + 0x50))
                                     (*(undefined8 *)(pArchive_name_local + 0x60),mVar2 + 0x1e,
                                      read_callback_local,sVar10);
                  if (sVar12 != sVar10) {
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x13';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                  uVar13 = (**(code **)(pArchive_name_local + 0x50))
                                     (*(undefined8 *)(pArchive_name_local + 0x60),
                                      sVar10 + mVar2 + 0x1e,&pState,local_334);
                  if (uVar13 != local_334) {
                    if (pArchive_name_local != (char *)0x0) {
                      pArchive_name_local[0x1c] = '\x13';
                      pArchive_name_local[0x1d] = '\0';
                      pArchive_name_local[0x1e] = '\0';
                      pArchive_name_local[0x1f] = '\0';
                    }
                    return 0;
                  }
                }
              }
              if (ppmStack_330 != (mz_zip_internal_state **)0x0) {
                if (comp_size < 0xffffffff) {
                  local_498 = (mz_uint64 *)0x0;
                  local_4a8 = (mz_uint64 *)0x0;
                }
                else {
                  local_498 = &comp_size;
                  local_4a8 = &archive_name_size;
                }
                if (cur_archive_file_ofs < 0xffffffff) {
                  local_4b8 = (mz_uint64 *)0x0;
                }
                else {
                  local_4b8 = &cur_archive_file_ofs;
                }
                mVar9 = mz_zip_writer_create_zip64_extra_data
                                  ((mz_uint8 *)&pState,local_498,local_4a8,local_4b8);
                local_334._0_2_ = (mz_uint16)mVar9;
              }
              mVar6 = mz_zip_writer_add_to_central_dir
                                ((mz_zip_archive *)pArchive_name_local,(char *)read_callback_local,
                                 filename_size,ppmStack_330,(mz_uint16)local_334,pComment,
                                 comment_size,comp_size,archive_name_size,
                                 num_alignment_padding_bytes,local_dir_header_ofs._6_2_,level._2_2_,
                                 local_dir_header_ofs._4_2_,local_dir_header_ofs._2_2_,
                                 cur_archive_file_ofs,ext_attributes,user_extra_data_central,
                                 user_extra_data_central_len);
              if (mVar6 == 0) {
                pZip_local._0_4_ = 0;
              }
              else {
                *(int *)(pArchive_name_local + 0x10) = *(int *)(pArchive_name_local + 0x10) + 1;
                *(mz_uint64 *)pArchive_name_local = uncomp_size;
                pZip_local._0_4_ = 1;
              }
            }
          }
          else {
            if (pArchive_name_local != (char *)0x0) {
              pArchive_name_local[0x1c] = '\x0f';
              pArchive_name_local[0x1d] = '\0';
              pArchive_name_local[0x1e] = '\0';
              pArchive_name_local[0x1f] = '\0';
            }
            pZip_local._0_4_ = 0;
          }
        }
        else {
          if (pArchive_name_local != (char *)0x0) {
            pArchive_name_local[0x1c] = '\x19';
            pArchive_name_local[0x1d] = '\0';
            pArchive_name_local[0x1e] = '\0';
            pArchive_name_local[0x1f] = '\0';
          }
          pZip_local._0_4_ = 0;
        }
      }
    }
    else {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      }
      pZip_local._0_4_ = 0;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_writer_add_read_buf_callback(
    mz_zip_archive *pZip, const char *pArchive_name,
    mz_file_read_func read_callback, void *callback_opaque, mz_uint64 max_size,
    const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_uint32 ext_attributes,
    const char *user_extra_data, mz_uint user_extra_data_len,
    const char *user_extra_data_central, mz_uint user_extra_data_central_len) {
  mz_uint16 gen_flags;
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size,
                                  uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_zip_internal_state *pState;
  mz_uint64 file_ofs = 0, cur_archive_header_file_ofs;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  gen_flags = (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
                  ? 0
                  : MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

  if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
    gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

  /* Sanity checks */
  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  if ((!pState->m_zip64) && (max_size > MZ_UINT32_MAX)) {
    /* Source file is too large for non-zip64 */
    /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    pState->m_zip64 = MZ_TRUE;
  }

  /* We could support this, but why? */
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  if (pState->m_zip64) {
    if (pZip->m_total_files == MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
  } else {
    if (pZip->m_total_files == MZ_UINT16_MAX) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
    }
  }

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size +
       MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!pState->m_zip64) {
    /* Bail early if the archive would obviously become too large */
    if ((pZip->m_archive_size + num_alignment_padding_bytes +
         MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size +
         MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
         user_extra_data_len + pState->m_central_dir.m_size +
         MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024 +
         MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) >
        0xFFFFFFFF) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

#ifndef MINIZ_NO_TIME
  if (pFile_time) {
    mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
  }
#else
  (void)pFile_time;
#endif

  if (max_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes)) {
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
  }

  cur_archive_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_archive_file_ofs;

  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (max_size && level) {
    method = MZ_DEFLATED;
  }

  MZ_CLEAR_ARR(local_dir_header);
  if (pState->m_zip64) {
    if (max_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
      pExtra_data = extra_data;
      if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
            (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
      else
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, NULL, NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method,
            gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data,
                       extra_size) != extra_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += extra_size;
  } else {
    if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
      return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)user_extra_data_len, 0, 0, 0, method, gen_flags,
            dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;
  }

  if (user_extra_data_len > 0) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       user_extra_data,
                       user_extra_data_len) != user_extra_data_len)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += user_extra_data_len;
  }

  if (max_size) {
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!level) {
      while (1) {
        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if (n == 0)
          break;

        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                           n) != n) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        cur_archive_file_ofs += n;
      }
      uncomp_size = file_ofs;
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
      }

      for (;;) {
        tdefl_status status;
        tdefl_flush flush = TDEFL_NO_FLUSH;

        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          break;
        }

        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);

        if (pZip->m_pNeeds_keepalive != NULL &&
            pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
          flush = TDEFL_FULL_FLUSH;

        if (n == 0)
          flush = TDEFL_FINISH;

        status = tdefl_compress_buffer(pComp, pRead_buf, n, flush);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY) {
          mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
          break;
        }
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return MZ_FALSE;
      }

      uncomp_size = file_ofs;
      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  if (!(level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)) {
    mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
    mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

    MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
    MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
    if (pExtra_data == NULL) {
      if (comp_size > MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

      MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
    } else {
      MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
      local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
    }

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_footer,
                       local_dir_footer_size) != local_dir_footer_size)
      return MZ_FALSE;

    cur_archive_file_ofs += local_dir_footer_size;
  }

  if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE) {
    if (pExtra_data != NULL) {
      extra_size = mz_zip_writer_create_zip64_extra_data(
          extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
          (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
          (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                  : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len),
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : uncomp_size,
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : comp_size,
            uncomp_crc32, method, gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    cur_archive_header_file_ofs = local_dir_header_ofs;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    if (pExtra_data != NULL) {
      cur_archive_header_file_ofs += sizeof(local_dir_header);

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         pArchive_name,
                         archive_name_size) != archive_name_size) {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
      }

      cur_archive_header_file_ofs += archive_name_size;

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         extra_data, extra_size) != extra_size)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

      cur_archive_header_file_ofs += extra_size;
    }
  }

  if (pExtra_data != NULL) {
    extra_size = mz_zip_writer_create_zip64_extra_data(
        extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
        (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
        (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
  }

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data,
          (mz_uint16)extra_size, pComment, comment_size, uncomp_size, comp_size,
          uncomp_crc32, method, gen_flags, dos_time, dos_date,
          local_dir_header_ofs, ext_attributes, user_extra_data_central,
          user_extra_data_central_len))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}